

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<capnp::Capability::Client,_kj::Canceler::AdapterImpl<capnp::Capability::Client>_>
::fulfill(AdapterPromiseNode<capnp::Capability::Client,_kj::Canceler::AdapterImpl<capnp::Capability::Client>_>
          *this,Client *value)

{
  Client *value_00;
  ExceptionOr<capnp::Capability::Client> local_1c8;
  Client *local_18;
  Client *value_local;
  AdapterPromiseNode<capnp::Capability::Client,_kj::Canceler::AdapterImpl<capnp::Capability::Client>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (Client *)this;
    value_00 = mv<capnp::Capability::Client>(value);
    ExceptionOr<capnp::Capability::Client>::ExceptionOr(&local_1c8,value_00);
    ExceptionOr<capnp::Capability::Client>::operator=(&this->result,&local_1c8);
    ExceptionOr<capnp::Capability::Client>::~ExceptionOr(&local_1c8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }